

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestCaseGroup *
vkt::api::anon_unknown_1::createGroup
          (TestContext *testCtx,char *name,char *desc,CaseDescriptions *cases)

{
  TestCaseGroup *pTVar1;
  DefaultDeleter<tcu::TestCaseGroup> local_45 [13];
  undefined1 local_38 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  CaseDescriptions *cases_local;
  char *desc_local;
  char *name_local;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       cases;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,name,desc);
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_45);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,pTVar1
            );
  addCases<vkt::api::(anonymous_namespace)::Instance>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Instance> *)
             group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data._8_8_);
  addCases<vkt::api::(anonymous_namespace)::Device>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Device> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x18));
  addCases<vkt::api::(anonymous_namespace)::DeviceMemory>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::DeviceMemory> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x30));
  addCases<vkt::api::(anonymous_namespace)::Buffer>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Buffer> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x48));
  addCases<vkt::api::(anonymous_namespace)::BufferView>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::BufferView> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x60));
  addCases<vkt::api::(anonymous_namespace)::Image>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Image> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x78));
  addCases<vkt::api::(anonymous_namespace)::ImageView>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::ImageView> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x90));
  addCases<vkt::api::(anonymous_namespace)::Semaphore>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Semaphore> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0xa8));
  addCases<vkt::api::(anonymous_namespace)::Event>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Event> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0xc0));
  addCases<vkt::api::(anonymous_namespace)::Fence>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Fence> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0xd8));
  addCases<vkt::api::(anonymous_namespace)::QueryPool>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::QueryPool> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0xf0));
  addCases<vkt::api::(anonymous_namespace)::Sampler>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Sampler> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x1b0));
  addCasesWithProgs<vkt::api::(anonymous_namespace)::ShaderModule>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::ShaderModule> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x108));
  addCases<vkt::api::(anonymous_namespace)::PipelineCache>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::PipelineCache> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x120));
  addCases<vkt::api::(anonymous_namespace)::PipelineLayout>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::PipelineLayout> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x138));
  addCases<vkt::api::(anonymous_namespace)::RenderPass>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::RenderPass> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x150));
  addCasesWithProgs<vkt::api::(anonymous_namespace)::GraphicsPipeline>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::GraphicsPipeline> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x168));
  addCasesWithProgs<vkt::api::(anonymous_namespace)::ComputePipeline>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::ComputePipeline> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x180));
  addCases<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x198));
  addCases<vkt::api::(anonymous_namespace)::DescriptorPool>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::DescriptorPool> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x1c8));
  addCases<vkt::api::(anonymous_namespace)::DescriptorSet>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::DescriptorSet> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x1e0));
  addCases<vkt::api::(anonymous_namespace)::Framebuffer>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::Framebuffer> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x1f8));
  addCases<vkt::api::(anonymous_namespace)::CommandPool>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::CommandPool> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x210));
  addCases<vkt::api::(anonymous_namespace)::CommandBuffer>
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,
             (CaseDescription<vkt::api::(anonymous_namespace)::CommandBuffer> *)
             (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_ + 0x228));
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createGroup (tcu::TestContext& testCtx, const char* name, const char* desc, const CaseDescriptions& cases)
{
	MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, name, desc));

	addCases			(group, cases.instance);
	addCases			(group, cases.device);
	addCases			(group, cases.deviceMemory);
	addCases			(group, cases.buffer);
	addCases			(group, cases.bufferView);
	addCases			(group, cases.image);
	addCases			(group, cases.imageView);
	addCases			(group, cases.semaphore);
	addCases			(group, cases.event);
	addCases			(group, cases.fence);
	addCases			(group, cases.queryPool);
	addCases			(group, cases.sampler);
	addCasesWithProgs	(group, cases.shaderModule);
	addCases			(group, cases.pipelineCache);
	addCases			(group, cases.pipelineLayout);
	addCases			(group, cases.renderPass);
	addCasesWithProgs	(group, cases.graphicsPipeline);
	addCasesWithProgs	(group, cases.computePipeline);
	addCases			(group, cases.descriptorSetLayout);
	addCases			(group, cases.descriptorPool);
	addCases			(group, cases.descriptorSet);
	addCases			(group, cases.framebuffer);
	addCases			(group, cases.commandPool);
	addCases			(group, cases.commandBuffer);

	return group.release();
}